

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

RowSetEntry * rowSetNDeepTree(RowSetEntry **ppList,int iDepth)

{
  RowSetEntry *pRVar1;
  RowSetEntry *pRVar2;
  
  pRVar2 = *ppList;
  if (pRVar2 == (RowSetEntry *)0x0) {
    pRVar2 = (RowSetEntry *)0x0;
  }
  else if (iDepth < 2) {
    *ppList = pRVar2->pRight;
    pRVar2->pRight = (RowSetEntry *)0x0;
    pRVar2->pLeft = (RowSetEntry *)0x0;
  }
  else {
    pRVar2 = rowSetNDeepTree(ppList,iDepth + -1);
    pRVar1 = *ppList;
    if (pRVar1 != (RowSetEntry *)0x0) {
      pRVar1->pLeft = pRVar2;
      *ppList = pRVar1->pRight;
      pRVar2 = rowSetNDeepTree(ppList,iDepth + -1);
      pRVar1->pRight = pRVar2;
      pRVar2 = pRVar1;
    }
  }
  return pRVar2;
}

Assistant:

static struct RowSetEntry *rowSetNDeepTree(
  struct RowSetEntry **ppList,
  int iDepth
){
  struct RowSetEntry *p;         /* Root of the new tree */
  struct RowSetEntry *pLeft;     /* Left subtree */
  if( *ppList==0 ){ /*OPTIMIZATION-IF-TRUE*/
    /* Prevent unnecessary deep recursion when we run out of entries */
    return 0;
  }
  if( iDepth>1 ){   /*OPTIMIZATION-IF-TRUE*/
    /* This branch causes a *balanced* tree to be generated.  A valid tree
    ** is still generated without this branch, but the tree is wildly
    ** unbalanced and inefficient. */
    pLeft = rowSetNDeepTree(ppList, iDepth-1);
    p = *ppList;
    if( p==0 ){     /*OPTIMIZATION-IF-FALSE*/
      /* It is safe to always return here, but the resulting tree
      ** would be unbalanced */
      return pLeft;
    }
    p->pLeft = pLeft;
    *ppList = p->pRight;
    p->pRight = rowSetNDeepTree(ppList, iDepth-1);
  }else{
    p = *ppList;
    *ppList = p->pRight;
    p->pLeft = p->pRight = 0;
  }
  return p;
}